

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

string * __thiscall
fasttext::Dictionary::getWord_abi_cxx11_(string *__return_storage_ptr__,Dictionary *this,int32_t id)

{
  if (id < 0) {
    __assert_fail("id >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Lizhen0909[P]LSHVec/src/dictionary.cc"
                  ,0x8a,"std::string fasttext::Dictionary::getWord(int32_t) const");
  }
  if (id < this->size_) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)
               ((this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                ._M_impl.super__Vector_impl_data._M_start + (uint)id));
    return __return_storage_ptr__;
  }
  __assert_fail("id < size_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Lizhen0909[P]LSHVec/src/dictionary.cc"
                ,0x8b,"std::string fasttext::Dictionary::getWord(int32_t) const");
}

Assistant:

std::string Dictionary::getWord(int32_t id) const {
  assert(id >= 0);
  assert(id < size_);
  return words_[id].word;
}